

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O1

void Sim_UtilCountPairsAll(Sym_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  timespec ts;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  p->nPairsSymm = 0;
  p->nPairsNonSymm = 0;
  if (0 < p->nOutputs) {
    lVar5 = 0;
    do {
      if (((p->vPairsTotal->nSize <= lVar5) || (p->vPairsSym->nSize <= lVar5)) ||
         (p->vPairsNonSym->nSize <= lVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vPairsTotal->pArray[lVar5];
      iVar2 = p->vPairsSym->pArray[lVar5];
      iVar3 = p->vPairsNonSym->pArray[lVar5];
      if (iVar1 < iVar3 + iVar2) {
        __assert_fail("nPairsTotal >= nPairsSym + nPairsNonSym",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sim/simUtils.c"
                      ,0x29f,"void Sim_UtilCountPairsAll(Sym_Man_t *)");
      }
      if (iVar1 != iVar3 + iVar2) {
        if (p->vMatrSymms->nSize <= lVar5) {
LAB_0046d085:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (p->vSupports->nSize <= lVar5) {
LAB_0046d066:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        iVar2 = Sim_UtilCountPairsOne
                          ((Extra_BitMat_t *)p->vMatrSymms->pArray[lVar5],
                           (Vec_Int_t *)p->vSupports->pArray[lVar5]);
        if (p->vMatrNonSymms->nSize <= lVar5) goto LAB_0046d085;
        if (p->vSupports->nSize <= lVar5) goto LAB_0046d066;
        iVar3 = Sim_UtilCountPairsOne
                          ((Extra_BitMat_t *)p->vMatrNonSymms->pArray[lVar5],
                           (Vec_Int_t *)p->vSupports->pArray[lVar5]);
        if (iVar1 < iVar3 + iVar2) {
          __assert_fail("nPairsTotal >= nPairsSym + nPairsNonSym",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sim/simUtils.c"
                        ,0x2a8,"void Sim_UtilCountPairsAll(Sym_Man_t *)");
        }
        if (p->vPairsSym->nSize <= lVar5) {
LAB_0046d047:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->vPairsSym->pArray[lVar5] = iVar2;
        if (p->vPairsNonSym->nSize <= lVar5) goto LAB_0046d047;
        p->vPairsNonSym->pArray[lVar5] = iVar3;
      }
      p->nPairsSymm = p->nPairsSymm + iVar2;
      p->nPairsNonSymm = p->nPairsNonSymm + iVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->nOutputs);
  }
  p->nPairsRem = p->nPairsTotal - (p->nPairsSymm + p->nPairsNonSymm);
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeCount = p->timeCount + lVar5 + lVar4;
  return;
}

Assistant:

void Sim_UtilCountPairsAll( Sym_Man_t * p )
{
    int nPairsTotal, nPairsSym, nPairsNonSym, i;
    abctime clk;
clk = Abc_Clock();
    p->nPairsSymm    = 0;
    p->nPairsNonSymm = 0;
    for ( i = 0; i < p->nOutputs; i++ )
    {
        nPairsTotal  = Vec_IntEntry(p->vPairsTotal, i);
        nPairsSym    = Vec_IntEntry(p->vPairsSym,   i);
        nPairsNonSym = Vec_IntEntry(p->vPairsNonSym,i);
        assert( nPairsTotal >= nPairsSym + nPairsNonSym ); 
        if ( nPairsTotal == nPairsSym + nPairsNonSym )
        {
            p->nPairsSymm    += nPairsSym;
            p->nPairsNonSymm += nPairsNonSym;
            continue;
        }
        nPairsSym    = Sim_UtilCountPairsOne( (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrSymms,   i), Vec_VecEntryInt(p->vSupports, i) );
        nPairsNonSym = Sim_UtilCountPairsOne( (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrNonSymms,i), Vec_VecEntryInt(p->vSupports, i) );
        assert( nPairsTotal >= nPairsSym + nPairsNonSym ); 
        Vec_IntWriteEntry( p->vPairsSym,    i, nPairsSym );
        Vec_IntWriteEntry( p->vPairsNonSym, i, nPairsNonSym );
        p->nPairsSymm    += nPairsSym;
        p->nPairsNonSymm += nPairsNonSym;
//        printf( "%d ", nPairsTotal - nPairsSym - nPairsNonSym );
    }
//printf( "\n" );
    p->nPairsRem = p->nPairsTotal-p->nPairsSymm-p->nPairsNonSymm;
p->timeCount += Abc_Clock() - clk;
}